

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlGetDocEntity(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val;
  xmlEntityPtr val_00;
  uint local_34;
  int n_name;
  xmlChar *name;
  int n_doc;
  xmlDoc *doc;
  xmlEntityPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 1; name._4_4_ = name._4_4_ + 1) {
    for (local_34 = 0; (int)local_34 < 5; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_const_xmlChar_ptr(local_34,1);
      val_00 = (xmlEntityPtr)xmlGetDocEntity(0,val);
      desret_xmlEntityPtr(val_00);
      call_tests = call_tests + 1;
      des_const_xmlChar_ptr(local_34,val,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetDocEntity",(ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)name._4_4_);
        printf(" %d",(ulong)local_34);
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlGetDocEntity(void) {
    int test_ret = 0;

    int mem_base;
    xmlEntityPtr ret_val;
    const xmlDoc * doc; /* the document referencing the entity */
    int n_doc;
    const xmlChar * name; /* the entity name */
    int n_name;

    for (n_doc = 0;n_doc < gen_nb_const_xmlDoc_ptr;n_doc++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
        mem_base = xmlMemBlocks();
        doc = gen_const_xmlDoc_ptr(n_doc, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);

        ret_val = xmlGetDocEntity(doc, name);
        desret_xmlEntityPtr(ret_val);
        call_tests++;
        des_const_xmlDoc_ptr(n_doc, doc, 0);
        des_const_xmlChar_ptr(n_name, name, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlGetDocEntity",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_doc);
            printf(" %d", n_name);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}